

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O0

SimpleWaveHeader * __thiscall
ASDCP::Wav::SimpleWaveHeader::WriteToFile(SimpleWaveHeader *this,FileWriter *OutFile)

{
  int iVar1;
  size_t sVar2;
  byte_t *pbVar3;
  size_t sVar4;
  uint in_EDX;
  ui32_t RIFF_len;
  byte_t *p;
  byte_t tmp_header [46];
  ui32_t write_count;
  FileWriter *OutFile_local;
  SimpleWaveHeader *this_local;
  
  iVar1 = *(int *)(OutFile + 0x14);
  sVar2 = Kumu::i2p<ASDCP::fourcc>(FCC_RIFF,(byte_t *)&p);
  pbVar3 = (byte_t *)(sVar2 + (long)&p);
  sVar2 = Kumu::i2p<unsigned_int>(iVar1 + 0x26,pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<ASDCP::fourcc>(FCC_WAVE,pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<ASDCP::fourcc>(FCC_fmt_,pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_int>(WriteToFile::fmt_len,pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_short>(*(unsigned_short *)OutFile,pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_short>(*(unsigned_short *)(OutFile + 2),pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_int>(*(uint *)(OutFile + 4),pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_int>(*(uint *)(OutFile + 8),pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_short>(*(unsigned_short *)(OutFile + 0xc),pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_short>(*(unsigned_short *)(OutFile + 0xe),pbVar3);
  pbVar3 = pbVar3 + sVar2;
  sVar2 = Kumu::i2p<unsigned_short>(*(unsigned_short *)(OutFile + 0x10),pbVar3);
  sVar4 = Kumu::i2p<ASDCP::fourcc>(FCC_data,pbVar3 + sVar2);
  Kumu::i2p<unsigned_int>(*(uint *)(OutFile + 0x14),pbVar3 + sVar2 + sVar4);
  Kumu::FileWriter::Write((uchar *)this,in_EDX,(uint *)&p);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::Wav::SimpleWaveHeader::WriteToFile(Kumu::FileWriter& OutFile) const
{
  ui32_t write_count;
  byte_t tmp_header[SimpleWavHeaderLength];
  byte_t* p = tmp_header;

  static ui32_t fmt_len =
    sizeof(format)
    + sizeof(nchannels)
    + sizeof(samplespersec)
    + sizeof(avgbps)
    + sizeof(blockalign)
    + sizeof(bitspersample)
    + sizeof(cbsize);

  ui32_t RIFF_len = data_len + SimpleWavHeaderLength - 8;

  p += Kumu::i2p<fourcc>(FCC_RIFF, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(RIFF_len), p);
  p += Kumu::i2p<fourcc>(FCC_WAVE, p);
  p += Kumu::i2p<fourcc>(FCC_fmt_, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(fmt_len), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(format), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(nchannels), p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(samplespersec), p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(avgbps), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(blockalign), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(bitspersample), p);
  p += Kumu::i2p<ui16_t>(KM_i16_LE(cbsize), p);
  p += Kumu::i2p<fourcc>(FCC_data, p);
  p += Kumu::i2p<ui32_t>(KM_i32_LE(data_len), p);

  return OutFile.Write(tmp_header, SimpleWavHeaderLength, &write_count);
}